

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O2

gzFile gzdopen(int fd,char *mode)

{
  char *__s;
  gzFile pgVar1;
  
  if ((fd != -1) && (__s = (char *)malloc(0x13), __s != (char *)0x0)) {
    snprintf(__s,0x13,"<fd:%d>",(ulong)(uint)fd);
    pgVar1 = gz_open(__s,fd,mode);
    free(__s);
    return pgVar1;
  }
  return (gzFile)0x0;
}

Assistant:

gzFile ZEXPORT gzdopen(fd, mode)
    int fd;
    const char *mode;
{
    char *path;         /* identifier for error messages */
    gzFile gz;

    if (fd == -1 || (path = (char *)malloc(7 + 3 * sizeof(int))) == NULL)
        return NULL;
#if !defined(NO_snprintf) && !defined(NO_vsnprintf)
    (void)snprintf(path, 7 + 3 * sizeof(int), "<fd:%d>", fd);
#else
    sprintf(path, "<fd:%d>", fd);   /* for debugging */
#endif
    gz = gz_open(path, fd, mode);
    free(path);
    return gz;
}